

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

char * __thiscall duckdb::StrfTimeFormat::Write2(StrfTimeFormat *this,char *target,uint8_t value)

{
  if (9 < value) {
    *(undefined2 *)target =
         *(undefined2 *)(duckdb_fmt::v6::internal::basic_data<void>::digits + (ulong)value * 2);
    return target + 2;
  }
  *target = value | 0x30;
  return target + 1;
}

Assistant:

char *StrfTimeFormat::Write2(char *target, uint8_t value) const {
	D_ASSERT(value < 100);
	if (value >= 10) {
		return WritePadded2(target, value);
	} else {
		*target = char(uint8_t('0') + value);
		return target + 1;
	}
}